

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

int thread_main(void *data)

{
  float fVar1;
  double dVar2;
  float v;
  Thread *thread;
  void *data_local;
  
  glfwMakeContextCurrent(*data);
  glfwSwapInterval(1);
  while (running != '\0') {
    dVar2 = glfwGetTime();
    dVar2 = sin(dVar2 * 2.0);
    fVar1 = (float)ABS(dVar2);
    glClearColor(*(float *)((long)data + 0x10) * fVar1,*(float *)((long)data + 0x14) * fVar1,
                 *(float *)((long)data + 0x18) * fVar1,0);
    glClear(0x4000);
    glfwSwapBuffers(*data);
  }
  glfwMakeContextCurrent((GLFWwindow *)0x0);
  return 0;
}

Assistant:

static int thread_main(void* data)
{
    const Thread* thread = (const Thread*) data;

    glfwMakeContextCurrent(thread->window);
    glfwSwapInterval(1);

    while (running)
    {
        const float v = (float) fabs(sin(glfwGetTime() * 2.f));
        glClearColor(thread->r * v, thread->g * v, thread->b * v, 0.f);

        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(thread->window);
    }

    glfwMakeContextCurrent(NULL);
    return 0;
}